

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Compiler.cpp
# Opt level: O2

ProcessorBase * __thiscall soul::Compiler::findMainProcessor(Compiler *this,BuildSettings *settings)

{
  pointer ppVar1;
  Namespace *pNVar2;
  ProcessorBase *pPVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  _Alloc_hider _Var4;
  pointer ppVar5;
  pool_ptr<soul::AST::Namespace> *this_00;
  vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
  mainProcessors;
  pool_ptr<soul::AST::ProcessorBase> pb;
  pool_ptr<soul::AST::ProcessorBase> main;
  _Vector_base<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
  local_2b8;
  CodeLocation local_2a0;
  pool_ref<soul::AST::ModuleBase> local_290;
  CompileMessage local_288;
  string local_248;
  CompileMessage local_228;
  CompileMessage local_1f0;
  CompileMessage local_1b8;
  undefined1 local_180 [248];
  ArrayWithPreallocation<soul::Identifier,_8UL> local_88;
  
  if ((settings->mainProcessor)._M_string_length == 0) {
    local_2b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = &this->topLevelNamespace;
    pNVar2 = pool_ptr<soul::AST::Namespace>::operator*(this_00);
    ASTUtilities::findAllMainProcessors
              (&pNVar2->super_ModuleBase,
               (vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
                *)&local_2b8);
    ppVar1 = local_2b8._M_impl.super__Vector_impl_data._M_finish;
    if (8 < (ulong)((long)local_2b8._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_2b8._M_impl.super__Vector_impl_data._M_start)) {
      local_180._0_8_ = local_180 + 0x18;
      local_180._8_8_ = 0;
      local_180._16_8_ = 4;
      for (ppVar5 = local_2b8._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar1;
          ppVar5 = ppVar5 + 1) {
        Errors::multipleProcessorsMarkedAsMain<>();
        pPVar3 = ppVar5->object;
        local_2a0.sourceCode.object =
             (pPVar3->super_ModuleBase).super_ASTObject.context.location.sourceCode.object;
        if (local_2a0.sourceCode.object != (SourceCodeText *)0x0) {
          ((local_2a0.sourceCode.object)->super_RefCountedObject).refCount =
               ((local_2a0.sourceCode.object)->super_RefCountedObject).refCount + 1;
        }
        local_2a0.location.data =
             (pPVar3->super_ModuleBase).super_ASTObject.context.location.location.data;
        CompileMessage::withLocation(&local_288,&local_228,&local_2a0);
        ArrayWithPreallocation<soul::CompileMessage,_4UL>::push_back
                  ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_180,&local_288);
        CompileMessage::~CompileMessage(&local_288);
        RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_2a0.sourceCode);
        CompileMessage::~CompileMessage(&local_228);
      }
      throwError((CompileMessageGroup *)local_180);
    }
    if ((long)local_2b8._M_impl.super__Vector_impl_data._M_finish -
        (long)local_2b8._M_impl.super__Vector_impl_data._M_start == 8) {
      pPVar3 = (local_2b8._M_impl.super__Vector_impl_data._M_start)->object;
    }
    else {
      pNVar2 = pool_ptr<soul::AST::Namespace>::operator*(this_00);
      ASTUtilities::scanForProcessorToUseAsMain((ASTUtilities *)local_180,&pNVar2->super_ModuleBase)
      ;
      if ((ProcessorBase *)local_180._0_8_ == (ProcessorBase *)0x0) {
        pNVar2 = pool_ptr<soul::AST::Namespace>::operator->(this_00);
        Errors::cannotFindMainProcessor<>();
        AST::Context::throwError
                  (&(pNVar2->super_ModuleBase).super_ASTObject.context,&local_1f0,false);
      }
      pPVar3 = pool_ptr<soul::AST::ProcessorBase>::operator*
                         ((pool_ptr<soul::AST::ProcessorBase> *)local_180);
    }
    std::
    _Vector_base<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
    ::~_Vector_base(&local_2b8);
    return pPVar3;
  }
  std::__cxx11::string::string((string *)&local_248,(string *)&settings->mainProcessor);
  IdentifierPath::fromString((IdentifierPath *)local_180,&(this->allocator).identifiers,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  args = extraout_RDX;
  if (local_180._8_8_ != 0) {
    pNVar2 = pool_ptr<soul::AST::Namespace>::operator->(&this->topLevelNamespace);
    ArrayWithPreallocation<soul::Identifier,_8UL>::ArrayWithPreallocation
              (&local_88,(ArrayWithPreallocation<soul::Identifier,_8UL> *)local_180);
    pPVar3 = (ProcessorBase *)&(pNVar2->super_ModuleBase).super_Scope;
    AST::Scope::getMatchingSubModules
              ((vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                *)&local_288,(Scope *)pPVar3,(IdentifierPath *)&local_88);
    ArrayWithPreallocation<soul::Identifier,_8UL>::clear(&local_88);
    for (_Var4._M_p = local_288.description._M_dataplus._M_p;
        _Var4._M_p != (pointer)local_288.description._M_string_length; _Var4._M_p = _Var4._M_p + 8)
    {
      local_290.object = *(ModuleBase **)_Var4._M_p;
      cast<soul::AST::ProcessorBase,soul::AST::ModuleBase>((soul *)&local_228,&local_290);
      if (local_228.description._M_dataplus._M_p != (pointer)0x0) {
        pPVar3 = pool_ptr<soul::AST::ProcessorBase>::operator*
                           ((pool_ptr<soul::AST::ProcessorBase> *)&local_228);
        break;
      }
    }
    std::
    _Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
    ::~_Vector_base((_Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                     *)&local_288);
    args = extraout_RDX_00;
    if (_Var4._M_p != (pointer)local_288.description._M_string_length) {
      ArrayWithPreallocation<soul::Identifier,_8UL>::clear
                ((ArrayWithPreallocation<soul::Identifier,_8UL> *)local_180);
      return pPVar3;
    }
  }
  local_288.description._M_dataplus._M_p = (pointer)0x0;
  local_288.description._M_string_length = 0;
  Errors::cannotFindMainProcessorWithName<std::__cxx11::string_const&>
            (&local_1b8,(Errors *)&settings->mainProcessor,args);
  CodeLocation::throwError((CodeLocation *)&local_288,&local_1b8);
}

Assistant:

AST::ProcessorBase& Compiler::findMainProcessor (const BuildSettings& settings)
{
    if (! settings.mainProcessor.empty())
    {
        auto path = IdentifierPath::fromString (allocator.identifiers, settings.mainProcessor);

        if (path.isValid())
            for (auto& m : topLevelNamespace->getMatchingSubModules (path))
                if (auto pb = cast<AST::ProcessorBase> (m))
                    return *pb;

        CodeLocation().throwError (Errors::cannotFindMainProcessorWithName (settings.mainProcessor));
    }

    std::vector<pool_ref<AST::ProcessorBase>> mainProcessors;
    ASTUtilities::findAllMainProcessors (*topLevelNamespace, mainProcessors);

    if (mainProcessors.size() > 1)
    {
        CompileMessageGroup group;

        for (auto& p : mainProcessors)
            group.messages.push_back (Errors::multipleProcessorsMarkedAsMain().withLocation (p->context.location));

        throwError (group);
    }

    if (mainProcessors.size() == 1)
        return mainProcessors.front();

    auto main = ASTUtilities::scanForProcessorToUseAsMain (*topLevelNamespace);

    if (main == nullptr)
        topLevelNamespace->context.throwError (Errors::cannotFindMainProcessor());

    return *main;
}